

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.h
# Opt level: O3

void __thiscall wasm::OptimizeInstructions::visitStore(OptimizeInstructions *this,Store *curr)

{
  byte bVar1;
  uint uVar2;
  Expression *pEVar3;
  
  if ((curr->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression.type.id != 1) {
    optimizeMemoryAccess(this,&curr->ptr,&curr->offset,(Name)(curr->memory).super_IString.str);
    optimizeStoredValue(this,&curr->value,(uint)curr->bytes);
    pEVar3 = curr->value;
    if (pEVar3->_id == UnaryId) {
      uVar2 = *(uint *)(pEVar3 + 1);
      if (uVar2 == 0x18) {
        (curr->valueType).id = 3;
        pEVar3 = (Expression *)pEVar3[1].type.id;
      }
      else {
        if (curr->isAtomic != false) {
          return;
        }
        if (0x2e < uVar2) {
          return;
        }
        if ((0x600600000000U >> ((ulong)uVar2 & 0x3f) & 1) == 0) {
          return;
        }
        bVar1 = curr->bytes;
        uVar2 = wasm::Type::getByteSize(&curr->valueType);
        if (uVar2 != bVar1) {
          return;
        }
        pEVar3 = (Expression *)pEVar3[1].type.id;
        (curr->valueType).id = (pEVar3->type).id;
      }
      curr->value = pEVar3;
    }
  }
  return;
}

Assistant:

bool operator==(const BasicType& other) const { return id == other; }